

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void aom_highbd_blend_a64_d16_mask_sse4_1
               (uint8_t *dst8,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params,int bd)

{
  CONV_BUF_TYPE *src0_00;
  int iVar1;
  uint16_t *dst_00;
  byte bVar2;
  short sVar3;
  int iVar4;
  undefined4 in_ECX;
  uint32_t dst_stride_00;
  uint32_t dst_stride_01;
  undefined8 in_RDX;
  undefined4 in_ESI;
  __m128i *in_RDI;
  int in_R8D;
  int in_stack_00000018;
  int in_stack_00000028;
  int in_stack_00000030;
  long in_stack_00000038;
  byte in_stack_00000040;
  __m128i mask_max;
  __m128i clip_high;
  __m128i clip_low;
  int shift;
  __m128i v_round_offset;
  int32_t round_offset;
  int round_bits;
  uint16_t *dst;
  uint32_t in_stack_000000d8;
  int in_stack_000000e8;
  uint32_t in_stack_000000f8;
  int in_stack_00000100;
  undefined4 in_stack_00000104;
  __m128i *in_stack_00000108;
  int in_stack_00000110;
  undefined4 in_stack_00000114;
  __m128i *in_stack_00000118;
  __m128i *in_stack_00000120;
  __m128i *in_stack_00000128;
  uint8_t *in_stack_00000150;
  uint32_t in_stack_00000158;
  int in_stack_00000160;
  __m128i *in_stack_00000168;
  int in_stack_00000170;
  __m128i *in_stack_00000178;
  __m128i *in_stack_00000180;
  __m128i *in_stack_00000188;
  uint32_t src1_stride_00;
  undefined4 in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  uint32_t mask_stride_00;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff20;
  uint32_t mask_stride_01;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  __m128i *in_stack_ffffffffffffffb8;
  
  mask_stride_00 = (int)in_RDI * 2;
  iVar1 = -(*(int *)(in_stack_00000038 + 0x14) + *(int *)(in_stack_00000038 + 0x18));
  iVar4 = iVar1 + 0xe;
  bVar2 = (char)iVar4 + in_stack_00000040;
  dst_stride_00 =
       (((1 << (bVar2 & 0x1f)) + (1 << (bVar2 - 1 & 0x1f))) - (1 << ((char)iVar4 - 1U & 0x1f))) *
       0x40;
  dst_00 = (uint16_t *)CONCAT44(dst_stride_00,dst_stride_00);
  dst_stride_01 = iVar1 + 0x14;
  sVar3 = (short)(1 << (in_stack_00000040 & 0x1f)) + -1;
  src0_00 = (CONV_BUF_TYPE *)CONCAT26(sVar3,CONCAT24(sVar3,CONCAT22(sVar3,sVar3)));
  mask_stride_01 = (uint32_t)in_RDX;
  if ((in_stack_00000028 == 0) && (in_stack_00000030 == 0)) {
    src1_stride_00 = (uint32_t)(CONCAT26(sVar3,CONCAT24(sVar3,CONCAT22(sVar3,sVar3))) >> 0x20);
    if (in_stack_00000018 == 4) {
      highbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1
                ((uint16_t *)CONCAT44(dst_stride_00,dst_stride_00),dst_stride_01,
                 (CONV_BUF_TYPE *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0,
                 (CONV_BUF_TYPE *)0x0,src1_stride_00,
                 (uint8_t *)CONCAT44(dst_stride_00,dst_stride_00),CONCAT22(sVar3,sVar3),
                 CONCAT22(sVar3,sVar3),
                 (__m128i *)CONCAT26(sVar3,CONCAT24(sVar3,CONCAT22(sVar3,sVar3))),
                 CONCAT22(sVar3,sVar3),(__m128i *)0x40004000400040,(__m128i *)0x40004000400040,
                 in_stack_ffffffffffffffb8);
    }
    else if (in_stack_00000018 == 8) {
      highbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1
                ((uint16_t *)0x0,src1_stride_00,src0_00,0x400040,(CONV_BUF_TYPE *)0x40004000400040,
                 CONCAT22(0x40,sVar3),(uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff20),
                 mask_stride_01,in_stack_ffffffffffffff30,in_RDI,in_stack_ffffffffffffff40,
                 (__m128i *)0x0,(__m128i *)0x0,
                 (__m128i *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    else {
      highbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1
                ((uint16_t *)0x0,src1_stride_00,src0_00,0x400040,(CONV_BUF_TYPE *)0x40004000400040,
                 CONCAT22(0x40,sVar3),(uint8_t *)CONCAT44(iVar4,dst_stride_00),mask_stride_00,
                 in_stack_ffffffffffffff10,in_R8D,
                 (__m128i *)CONCAT44(in_ECX,in_stack_ffffffffffffff20),mask_stride_01,
                 (__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),in_RDI,
                 (__m128i *)CONCAT44(dst_stride_00,in_stack_ffffffffffffff40));
    }
  }
  else if ((in_stack_00000028 == 1) && (in_stack_00000030 == 1)) {
    if (in_stack_00000018 == 4) {
      highbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1
                ((uint16_t *)0x0,0,
                 (CONV_BUF_TYPE *)CONCAT44(dst_stride_00,in_stack_ffffffffffffff40),
                 (uint32_t)((ulong)in_RDI >> 0x20),
                 (CONV_BUF_TYPE *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),
                 (uint32_t)((ulong)in_RDX >> 0x20),in_stack_00000150,in_stack_00000158,
                 in_stack_00000160,in_stack_00000168,in_stack_00000170,in_stack_00000178,
                 in_stack_00000180,in_stack_00000188);
    }
    else if (in_stack_00000018 == 8) {
      highbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1
                (dst_00,dst_stride_00,
                 (CONV_BUF_TYPE *)CONCAT26(sVar3,CONCAT24(0x40,in_stack_ffffffffffffff60)),
                 in_stack_ffffffffffffff5c,(CONV_BUF_TYPE *)0x0,0,dst8,in_stack_000000f8,
                 in_stack_00000100,in_stack_00000108,in_stack_00000110,in_stack_00000118,
                 in_stack_00000120,in_stack_00000128);
    }
    else {
      highbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1
                (dst_00,dst_stride_00,
                 (CONV_BUF_TYPE *)CONCAT26(sVar3,CONCAT24(0x40,in_stack_ffffffffffffff60)),
                 in_stack_ffffffffffffff5c,(CONV_BUF_TYPE *)0x0,0,(uint8_t *)src1,in_stack_000000d8,
                 (int)src0,in_stack_000000e8,(__m128i *)dst8,in_stack_000000f8,
                 (__m128i *)CONCAT44(in_stack_00000104,in_stack_00000100),in_stack_00000108,
                 (__m128i *)CONCAT44(in_stack_00000114,in_stack_00000110));
    }
  }
  else {
    aom_highbd_blend_a64_d16_mask_c
              ((uint8_t *)dst_00,dst_stride_00,
               (CONV_BUF_TYPE *)CONCAT44(dst_stride_01,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc,(CONV_BUF_TYPE *)0x0,0,
               (uint8_t *)CONCAT44(iVar4,dst_stride_00),mask_stride_00,in_stack_ffffffffffffff10,
               in_R8D,in_stack_ffffffffffffff20,mask_stride_01,
               (ConvolveParams *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),(int)in_RDI);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_d16_mask_sse4_1(
    uint8_t *dst8, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params, const int bd) {
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int32_t round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;
  const __m128i v_round_offset = _mm_set1_epi32(round_offset);
  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;

  const __m128i clip_low = _mm_setzero_si128();
  const __m128i clip_high = _mm_set1_epi16((1 << bd) - 1);
  const __m128i mask_max = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >=16
        highbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }

  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >=16
        highbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }
  } else {
    // Sub-sampling in only one axis doesn't seem to happen very much, so fall
    // back to the vanilla C implementation instead of having all the optimised
    // code for these.
    aom_highbd_blend_a64_d16_mask_c(dst8, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, w, h, subw,
                                    subh, conv_params, bd);
  }
}